

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O0

void __thiscall OSTEIDeriv1_Writer::WriteFormDeriv(OSTEIDeriv1_Writer *this)

{
  QAM_ iqam;
  QAM_ iqam_00;
  QAM_ iqam_01;
  QAM_ iqam_02;
  int *piVar1;
  ostream *poVar2;
  long in_RDI;
  int missing_center;
  string full_idx_z;
  string full_idx_y;
  string full_idx_x;
  string invar_4m;
  string invar_3m;
  string invar_2m;
  string invar_1m;
  string invar_4p;
  string invar_3p;
  string invar_2p;
  string invar_1p;
  string outvar;
  int ncart4m;
  int ncart3m;
  int ncart2m;
  int ncart4p;
  int ncart3p;
  int ncart2p;
  int ncart4;
  int ncart3;
  int ncart2;
  int ncart1;
  QAM am;
  GeneratorInfoBase *in_stack_ffffffffffffe958;
  int iVar3;
  QAM *in_stack_ffffffffffffe960;
  char *pcVar4;
  int in_stack_ffffffffffffe968;
  int in_stack_ffffffffffffe96c;
  QAM *in_stack_ffffffffffffe970;
  QAM *in_stack_ffffffffffffe9a8;
  char (*in_stack_ffffffffffffe9b8) [8];
  int *in_stack_ffffffffffffe9c0;
  char (*in_stack_ffffffffffffe9c8) [8];
  int *in_stack_ffffffffffffe9d0;
  char (*in_stack_ffffffffffffe9d8) [7];
  int *in_stack_ffffffffffffe9f0;
  char (*in_stack_ffffffffffffe9f8) [7];
  string local_8b0 [32];
  int local_890;
  int local_88c;
  string local_888 [32];
  int local_868;
  int local_864;
  string local_860 [32];
  int local_840;
  int local_83c;
  string local_838 [32];
  int local_818;
  int local_814;
  string local_810 [32];
  int local_7f0;
  int local_7ec;
  string local_7e8 [32];
  int local_7c8;
  int local_7c4;
  string local_7c0 [32];
  int local_7a0;
  int local_79c;
  string local_798 [32];
  int local_778;
  int local_774;
  string local_770 [32];
  int local_750;
  int local_74c;
  string local_748 [32];
  int local_728;
  int local_724;
  string local_720 [32];
  int local_700;
  int local_6fc;
  string local_6f8 [32];
  int local_6d8;
  int local_6d4;
  string local_6d0 [32];
  int local_6b0;
  int local_6ac;
  string local_6a8 [32];
  int local_688;
  int local_684;
  string local_680 [32];
  int local_660;
  int local_65c;
  string local_658 [32];
  int local_638;
  int local_634;
  string local_630 [32];
  int local_610;
  int local_60c;
  string local_608 [32];
  int local_5e8;
  int local_5e4;
  string local_5e0 [32];
  int local_5c0;
  int local_5bc;
  string local_5b8 [32];
  int local_598;
  int local_594;
  string local_590 [32];
  int local_570;
  int local_56c;
  string local_568 [32];
  int local_548;
  int local_544;
  string local_540 [32];
  int local_520;
  int local_51c;
  string local_518 [36];
  int local_4f4;
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [39];
  allocator local_489;
  string local_488 [80];
  string local_438 [39];
  allocator local_411;
  string local_410 [80];
  string local_3c0 [39];
  allocator local_399;
  string local_398 [80];
  string local_348 [39];
  allocator local_321;
  string local_320 [80];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  int local_288;
  int iStack_284;
  int local_280;
  int iStack_27c;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  int local_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  int local_178;
  int iStack_174;
  int local_170;
  int iStack_16c;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  int local_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  string local_b0 [32];
  string local_90 [32];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_3c;
  
  GeneratorInfoBase::FinalAM(in_stack_ffffffffffffe958);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_3c = NCART(*piVar1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_50 = NCART(*piVar1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_54 = NCART(*piVar1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_58 = NCART(*piVar1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_5c = NCART(*piVar1 + 1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_60 = NCART(*piVar1 + 1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_64 = NCART(*piVar1 + 1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_68 = NCART(*piVar1 + -1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_6c = NCART(*piVar1 + -1);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_70 = NCART(*piVar1 + -1);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_f0 = *piVar1 + 1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_ec = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_e8 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_e4 = *piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"2a",&local_111);
  iqam._M_elems[1] = in_stack_ffffffffffffe96c;
  iqam._M_elems[0] = in_stack_ffffffffffffe968;
  iqam._M_elems._8_8_ = in_stack_ffffffffffffe970;
  QAM::QAM(in_stack_ffffffffffffe960,iqam,(string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x1659dd);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_178 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_174 = *piVar1 + 1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_170 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_16c = *piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"2b",&local_199);
  iqam_00._M_elems[1] = in_stack_ffffffffffffe96c;
  iqam_00._M_elems[0] = in_stack_ffffffffffffe968;
  iqam_00._M_elems._8_8_ = in_stack_ffffffffffffe970;
  QAM::QAM(in_stack_ffffffffffffe960,iqam_00,(string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x165b78);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_200 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_1fc = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_1f8 = *piVar1 + 1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_1f4 = *piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"2c",&local_221);
  iqam_01._M_elems[1] = in_stack_ffffffffffffe96c;
  iqam_01._M_elems[0] = in_stack_ffffffffffffe968;
  iqam_01._M_elems._8_8_ = in_stack_ffffffffffffe970;
  QAM::QAM(in_stack_ffffffffffffe960,iqam_01,(string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x165d13);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_288 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_284 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  local_280 = *piVar1;
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20)
                          );
  iStack_27c = *piVar1 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"2d",&local_2a9);
  iqam_02._M_elems[1] = in_stack_ffffffffffffe96c;
  iqam_02._M_elems[0] = in_stack_ffffffffffffe968;
  iqam_02._M_elems._8_8_ = in_stack_ffffffffffffe970;
  QAM::QAM(in_stack_ffffffffffffe960,iqam_02,(string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x165eae);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"",&local_321);
  QAM::QAM(in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968,
           (int)((ulong)in_stack_ffffffffffffe960 >> 0x20),(int)in_stack_ffffffffffffe960,
           (string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x166006);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"",&local_399);
  QAM::QAM(in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968,
           (int)((ulong)in_stack_ffffffffffffe960 >> 0x20),(int)in_stack_ffffffffffffe960,
           (string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x16615e);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"",&local_411);
  QAM::QAM(in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968,
           (int)((ulong)in_stack_ffffffffffffe960 >> 0x20),(int)in_stack_ffffffffffffe960,
           (string *)in_stack_ffffffffffffe958);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x1662b6);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  QAM::operator[](in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"",&local_489);
  QAM::QAM(in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968,
           (int)((ulong)in_stack_ffffffffffffe960 >> 0x20),(int)in_stack_ffffffffffffe960,
           (string *)in_stack_ffffffffffffe958);
  iVar3 = (int)((ulong)in_stack_ffffffffffffe958 >> 0x20);
  HRRVarName_abi_cxx11_(in_stack_ffffffffffffe9a8);
  QAM::~QAM((QAM *)0x16640e);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "struct RecurInfo const * const aminfo_1 = &recurinfo_array[am_recur_map["
                          );
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,iVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
  std::operator<<(poVar2,"]];\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "struct RecurInfo const * const aminfo_2 = &recurinfo_array[am_recur_map["
                          );
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,iVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
  std::operator<<(poVar2,"]];\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "struct RecurInfo const * const aminfo_3 = &recurinfo_array[am_recur_map["
                          );
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,iVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
  std::operator<<(poVar2,"]];\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "struct RecurInfo const * const aminfo_4 = &recurinfo_array[am_recur_map["
                          );
  piVar1 = QAM::operator[](in_stack_ffffffffffffe960,iVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
  std::operator<<(poVar2,"]];\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"\n");
  std::__cxx11::string::string(local_4b0);
  std::__cxx11::string::string(local_4d0);
  std::__cxx11::string::string(local_4f0);
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  std::operator<<(poVar2,"int idx_x, idx_y, idx_z;\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  std::operator<<(poVar2,"int startidx = 0;\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"for(int n1 = 0; n1 < ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c);
  std::operator<<(poVar2,"; n1++)\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"for(int n2 = 0; n2 < ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50);
  std::operator<<(poVar2,"; n2++)\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"for(int n3 = 0; n3 < ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_54);
  std::operator<<(poVar2,"; n3++)\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"for(int n4 = 0; n4 < ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_58);
  std::operator<<(poVar2,"; n4++)\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  local_4f4 = OSTEI_GeneratorInfo::Deriv1_MissingCenter(*(OSTEI_GeneratorInfo **)(in_RDI + 0x18));
  if (local_4f4 != 0) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// First Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"struct RecurInfo const * aminfo_n1 = aminfo_1 + n1;\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_x = aminfo_n1->idx[0][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_y = aminfo_n1->idx[1][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_z = aminfo_n1->idx[2][2];\n");
    local_51c = local_50 * local_54 * local_58;
    local_520 = local_54 * local_58;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4b0,local_518);
    std::__cxx11::string::~string(local_518);
    local_544 = local_50 * local_54 * local_58;
    local_548 = local_54 * local_58;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4d0,local_540);
    std::__cxx11::string::~string(local_540);
    local_56c = local_50 * local_54 * local_58;
    local_570 = local_54 * local_58;
    pcVar4 = "+n4";
    iVar3 = (int)((ulong)&local_58 >> 0x20);
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4f0,local_568);
    std::__cxx11::string::~string(local_568);
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 0] = ");
    poVar2 = std::operator<<(poVar2,local_b0);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4b0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 1] = ");
    poVar2 = std::operator<<(poVar2,local_b0);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4d0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 2] = ");
    poVar2 = std::operator<<(poVar2,local_b0);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4f0);
    std::operator<<(poVar2,"];\n");
    piVar1 = QAM::operator[]((QAM *)pcVar4,iVar3);
    if (0 < *piVar1) {
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_x = aminfo_n1->idx[0][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_y = aminfo_n1->idx[1][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_z = aminfo_n1->idx[2][0];\n");
      local_594 = local_50 * local_54 * local_58;
      local_598 = local_54 * local_58;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4b0,local_590);
      std::__cxx11::string::~string(local_590);
      local_5bc = local_50 * local_54 * local_58;
      local_5c0 = local_54 * local_58;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4d0,local_5b8);
      std::__cxx11::string::~string(local_5b8);
      local_5e4 = local_50 * local_54 * local_58;
      local_5e8 = local_54 * local_58;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4f0,local_5e0);
      std::__cxx11::string::~string(local_5e0);
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_x >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 0] -= aminfo_n1->ijk[0] * ");
      poVar2 = std::operator<<(poVar2,local_2d0);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4b0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_y >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 1] -= aminfo_n1->ijk[1] * ");
      poVar2 = std::operator<<(poVar2,local_2d0);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4d0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_z >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 2] -= aminfo_n1->ijk[2] * ");
      poVar2 = std::operator<<(poVar2,local_2d0);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4f0);
      std::operator<<(poVar2,"];\n");
    }
  }
  if (local_4f4 != 1) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// Second Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"struct RecurInfo const * aminfo_n2 = aminfo_2 + n2;\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_x = aminfo_n2->idx[0][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_y = aminfo_n2->idx[1][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_z = aminfo_n2->idx[2][2];\n");
    local_60c = local_5c * local_54 * local_58;
    local_610 = local_54 * local_58;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4b0,local_608);
    std::__cxx11::string::~string(local_608);
    local_634 = local_5c * local_54 * local_58;
    local_638 = local_54 * local_58;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4d0,local_630);
    std::__cxx11::string::~string(local_630);
    local_65c = local_5c * local_54 * local_58;
    local_660 = local_54 * local_58;
    pcVar4 = "+n4";
    iVar3 = (int)((ulong)&local_58 >> 0x20);
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4f0,local_658);
    std::__cxx11::string::~string(local_658);
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 3] = ");
    poVar2 = std::operator<<(poVar2,local_138);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4b0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 4] = ");
    poVar2 = std::operator<<(poVar2,local_138);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4d0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 5] = ");
    poVar2 = std::operator<<(poVar2,local_138);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4f0);
    std::operator<<(poVar2,"];\n");
    piVar1 = QAM::operator[]((QAM *)pcVar4,iVar3);
    if (0 < *piVar1) {
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_x = aminfo_n2->idx[0][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_y = aminfo_n2->idx[1][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_z = aminfo_n2->idx[2][0];\n");
      local_684 = local_68 * local_54 * local_58;
      local_688 = local_54 * local_58;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4b0,local_680);
      std::__cxx11::string::~string(local_680);
      local_6ac = local_68 * local_54 * local_58;
      local_6b0 = local_54 * local_58;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4d0,local_6a8);
      std::__cxx11::string::~string(local_6a8);
      local_6d4 = local_68 * local_54 * local_58;
      local_6d8 = local_54 * local_58;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4f0,local_6d0);
      std::__cxx11::string::~string(local_6d0);
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_x >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 3] -= aminfo_n2->ijk[0] * ");
      poVar2 = std::operator<<(poVar2,local_348);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4b0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_y >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 4] -= aminfo_n2->ijk[1] * ");
      poVar2 = std::operator<<(poVar2,local_348);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4d0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_z >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 5] -= aminfo_n2->ijk[2] * ");
      poVar2 = std::operator<<(poVar2,local_348);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4f0);
      std::operator<<(poVar2,"];\n");
    }
  }
  if (local_4f4 != 2) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// Third Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"struct RecurInfo const * aminfo_n3 = aminfo_3 + n3;\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_x = aminfo_n3->idx[0][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_y = aminfo_n3->idx[1][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_z = aminfo_n3->idx[2][2];\n");
    local_6fc = local_50 * local_60 * local_58;
    local_700 = local_60 * local_58;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4b0,local_6f8);
    std::__cxx11::string::~string(local_6f8);
    local_724 = local_50 * local_60 * local_58;
    local_728 = local_60 * local_58;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4d0,local_720);
    std::__cxx11::string::~string(local_720);
    local_74c = local_50 * local_60 * local_58;
    local_750 = local_60 * local_58;
    pcVar4 = "+n4";
    iVar3 = (int)((ulong)&local_58 >> 0x20);
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               (char (*) [4])in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4f0,local_748);
    std::__cxx11::string::~string(local_748);
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 6] = ");
    poVar2 = std::operator<<(poVar2,local_1c0);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4b0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 7] = ");
    poVar2 = std::operator<<(poVar2,local_1c0);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4d0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 8] = ");
    poVar2 = std::operator<<(poVar2,local_1c0);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4f0);
    std::operator<<(poVar2,"];\n");
    piVar1 = QAM::operator[]((QAM *)pcVar4,iVar3);
    if (0 < *piVar1) {
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_x = aminfo_n3->idx[0][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_y = aminfo_n3->idx[1][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_z = aminfo_n3->idx[2][0];\n");
      local_774 = local_50 * local_6c * local_58;
      local_778 = local_6c * local_58;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4b0,local_770);
      std::__cxx11::string::~string(local_770);
      local_79c = local_50 * local_6c * local_58;
      local_7a0 = local_6c * local_58;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4d0,local_798);
      std::__cxx11::string::~string(local_798);
      local_7c4 = local_50 * local_6c * local_58;
      local_7c8 = local_6c * local_58;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 (char (*) [4])in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4f0,local_7c0);
      std::__cxx11::string::~string(local_7c0);
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_x >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 6] -= aminfo_n3->ijk[0] * ");
      poVar2 = std::operator<<(poVar2,local_3c0);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4b0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_y >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 7] -= aminfo_n3->ijk[1] * ");
      poVar2 = std::operator<<(poVar2,local_3c0);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4d0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_z >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 8] -= aminfo_n3->ijk[2] * ");
      poVar2 = std::operator<<(poVar2,local_3c0);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4f0);
      std::operator<<(poVar2,"];\n");
    }
  }
  if (local_4f4 != 3) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// Fourth Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"struct RecurInfo const * aminfo_n4 = aminfo_4 + n4;\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_x = aminfo_n4->idx[0][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_y = aminfo_n4->idx[1][2];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"idx_z = aminfo_n4->idx[2][2];\n");
    local_7ec = local_50 * local_54 * local_64;
    local_7f0 = local_54 * local_64;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4b0,local_7e8);
    std::__cxx11::string::~string(local_7e8);
    local_814 = local_50 * local_54 * local_64;
    local_818 = local_54 * local_64;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4d0,local_810);
    std::__cxx11::string::~string(local_810);
    local_83c = local_50 * local_54 * local_64;
    local_840 = local_54 * local_64;
    pcVar4 = "+idx_z";
    iVar3 = (int)((ulong)&local_64 >> 0x20);
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
               (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
               in_stack_ffffffffffffe9f8);
    std::__cxx11::string::operator=(local_4f0,local_838);
    std::__cxx11::string::~string(local_838);
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx +  9] = ");
    poVar2 = std::operator<<(poVar2,local_248);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4b0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 10] = ");
    poVar2 = std::operator<<(poVar2,local_248);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4d0);
    std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 11] = ");
    poVar2 = std::operator<<(poVar2,local_248);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_4f0);
    std::operator<<(poVar2,"];\n");
    piVar1 = QAM::operator[]((QAM *)pcVar4,iVar3);
    if (0 < *piVar1) {
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_x = aminfo_n4->idx[0][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_y = aminfo_n4->idx[1][0];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      std::operator<<(poVar2,"idx_z = aminfo_n4->idx[2][0];\n");
      local_864 = local_50 * local_54 * local_70;
      local_868 = local_54 * local_70;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4b0,local_860);
      std::__cxx11::string::~string(local_860);
      local_88c = local_50 * local_54 * local_70;
      local_890 = local_54 * local_70;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4d0,local_888);
      std::__cxx11::string::~string(local_888);
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                ((char (*) [4])in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                 (char (*) [5])in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 (char (*) [5])in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9f0,
                 in_stack_ffffffffffffe9f8);
      std::__cxx11::string::operator=(local_4f0,local_8b0);
      std::__cxx11::string::~string(local_8b0);
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_x >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx +  9] -= aminfo_n4->ijk[0] * ");
      poVar2 = std::operator<<(poVar2,local_438);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4b0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_y >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 10] -= aminfo_n4->ijk[1] * ");
      poVar2 = std::operator<<(poVar2,local_438);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4d0);
      std::operator<<(poVar2,"];\n");
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"if(idx_z >= 0) ");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,"[startidx + 11] -= aminfo_n4->ijk[2] * ");
      poVar2 = std::operator<<(poVar2,local_438);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::operator<<(poVar2,local_4f0);
      std::operator<<(poVar2,"];\n");
    }
  }
  if (local_4f4 == 0) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// First Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 0] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 3] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 6] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx +  9]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 1] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 4] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 7] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 10]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 2] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 5] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 8] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 11]);\n");
  }
  if (local_4f4 == 1) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// Second Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 3] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 0] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 6] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx +  9]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 4] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 1] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 7] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 10]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 5] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 2] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 8] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 11]);\n");
  }
  if (local_4f4 == 2) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// Third Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 6] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 0] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 3] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx +  9]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 7] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 1] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 4] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 10]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 8] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 2] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 5] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 11]);\n");
  }
  if (local_4f4 == 3) {
    std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    std::operator<<(poVar2,"// Fourth Center\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx +  9] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 0] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 3] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 6]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 10] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 1] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 4] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 7]);\n");
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 11] = -(");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 2] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2,"[startidx + 5] + ");
    poVar2 = std::operator<<(poVar2,local_90);
    std::operator<<(poVar2,"[startidx + 8]);\n");
  }
  std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent5_abi_cxx11_);
  std::operator<<(poVar2,"startidx += 12;\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent4_abi_cxx11_);
  std::operator<<(poVar2,"} // close loop for forming derivatives\n\n");
  std::__cxx11::string::~string(local_4f0);
  std::__cxx11::string::~string(local_4d0);
  std::__cxx11::string::~string(local_4b0);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  QAM::~QAM((QAM *)0x16aaf7);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteFormDeriv(void) const
{
    QAM am = info_.FinalAM();
    const int ncart1 = NCART(am[0]);
    const int ncart2 = NCART(am[1]);
    const int ncart3 = NCART(am[2]);
    const int ncart4 = NCART(am[3]);

    const int ncart2p = NCART(am[1]+1);
    const int ncart3p = NCART(am[2]+1);
    const int ncart4p = NCART(am[3]+1);
    const int ncart2m = NCART(am[1]-1);
    const int ncart3m = NCART(am[2]-1);
    const int ncart4m = NCART(am[3]-1);

    std::string outvar = HRRVarName(am);
    std::string invar_1p = HRRVarName(QAM({am[0]+1, am[1]  , am[2]  , am[3]  }, "2a"));
    std::string invar_2p = HRRVarName(QAM({am[0],   am[1]+1, am[2]  , am[3]  }, "2b"));
    std::string invar_3p = HRRVarName(QAM({am[0],   am[1]  , am[2]+1, am[3]  }, "2c"));
    std::string invar_4p = HRRVarName(QAM({am[0],   am[1]  , am[2]  , am[3]+1}, "2d"));
    std::string invar_1m = HRRVarName({am[0]-1, am[1]  , am[2]  , am[3]  });
    std::string invar_2m = HRRVarName({am[0],   am[1]-1, am[2]  , am[3]  });
    std::string invar_3m = HRRVarName({am[0],   am[1]  , am[2]-1, am[3]  });
    std::string invar_4m = HRRVarName({am[0],   am[1]  , am[2]  , am[3]-1});

    os_ << indent4 << "struct RecurInfo const * const aminfo_1 = &recurinfo_array[am_recur_map[" << am[0] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_2 = &recurinfo_array[am_recur_map[" << am[1] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_3 = &recurinfo_array[am_recur_map[" << am[2] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_4 = &recurinfo_array[am_recur_map[" << am[3] << "]];\n";
    os_ << "\n";

    std::string full_idx_x, full_idx_y, full_idx_z;
    //os_ << indent4 << "double * restrict " << outvar << " = " << ArrVarName(am)
    //               << " + real_abcd * " << ncart1*ncart2*ncart3*ncart4 << " * 12;\n\n";
    os_ << indent4 << "int idx_x, idx_y, idx_z;\n";
    os_ << indent4 << "int startidx = 0;\n";
    os_ << indent4 << "for(int n1 = 0; n1 < " << ncart1 << "; n1++)\n";
    os_ << indent4 << "for(int n2 = 0; n2 < " << ncart2 << "; n2++)\n";
    os_ << indent4 << "for(int n3 = 0; n3 < " << ncart3 << "; n3++)\n";
    os_ << indent4 << "for(int n4 = 0; n4 < " << ncart4 << "; n4++)\n";
    os_ << indent4 << "{\n";

    int missing_center = info_.Deriv1_MissingCenter();

    if(missing_center != 0)
    {
        os_ << "\n\n";
        os_ << indent5 << "// First Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n1 = aminfo_1 + n1;\n";
        os_ << indent5 << "idx_x = aminfo_n1->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n1->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n1->idx[2][2];\n";
        full_idx_x = StringBuilder("idx_x*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_y = StringBuilder("idx_y*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_z = StringBuilder("idx_z*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 0] = " << invar_1p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 1] = " << invar_1p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 2] = " << invar_1p << "[" << full_idx_z << "];\n";

        if(am[0] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n1->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n1->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n1->idx[2][0];\n";
            full_idx_x = StringBuilder("idx_x*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_y = StringBuilder("idx_y*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_z = StringBuilder("idx_z*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 0] -= aminfo_n1->ijk[0] * " << invar_1m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 1] -= aminfo_n1->ijk[1] * " << invar_1m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 2] -= aminfo_n1->ijk[2] * " << invar_1m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 1)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Second Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n2 = aminfo_2 + n2;\n";
        os_ << indent5 << "idx_x = aminfo_n2->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n2->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n2->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_x*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_y = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_y*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_z = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_z*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 3] = " << invar_2p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 4] = " << invar_2p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 5] = " << invar_2p << "[" << full_idx_z << "];\n";

        if(am[1] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n2->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n2->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n2->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_x*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_y = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_y*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_z = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_z*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 3] -= aminfo_n2->ijk[0] * " << invar_2m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 4] -= aminfo_n2->ijk[1] * " << invar_2m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 5] -= aminfo_n2->ijk[2] * " << invar_2m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 2)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Third Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n3 = aminfo_3 + n3;\n";
        os_ << indent5 << "idx_x = aminfo_n3->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n3->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n3->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_x*", ncart4, "+n4");
        full_idx_y = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_y*", ncart4, "+n4");
        full_idx_z = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_z*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 6] = " << invar_3p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 7] = " << invar_3p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 8] = " << invar_3p << "[" << full_idx_z << "];\n";

        if(am[2] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n3->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n3->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n3->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_x*", ncart4, "+n4");
            full_idx_y = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_y*", ncart4, "+n4");
            full_idx_z = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_z*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 6] -= aminfo_n3->ijk[0] * " << invar_3m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 7] -= aminfo_n3->ijk[1] * " << invar_3m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 8] -= aminfo_n3->ijk[2] * " << invar_3m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 3)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Fourth Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n4 = aminfo_4 + n4;\n";
        os_ << indent5 << "idx_x = aminfo_n4->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n4->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n4->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_x");
        full_idx_y = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_y");
        full_idx_z = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_z");
        os_ << indent5 << outvar << "[startidx +  9] = " << invar_4p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 10] = " << invar_4p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 11] = " << invar_4p << "[" << full_idx_z << "];\n";

        if(am[3] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n4->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n4->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n4->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_x");
            full_idx_y = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_y");
            full_idx_z = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_z");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx +  9] -= aminfo_n4->ijk[0] * " << invar_4m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 10] -= aminfo_n4->ijk[1] * " << invar_4m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 11] -= aminfo_n4->ijk[2] * " << invar_4m << "[" << full_idx_z << "];\n";
        }
    }

    if(missing_center == 0)
    {
        os_ << "\n\n";
        os_ << indent5 << "// First Center\n";
        os_ << indent5 << outvar << "[startidx + 0] = -(" << outvar << "[startidx + 3] + " << outvar << "[startidx + 6] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 1] = -(" << outvar << "[startidx + 4] + " << outvar << "[startidx + 7] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 2] = -(" << outvar << "[startidx + 5] + " << outvar << "[startidx + 8] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 1)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Second Center\n";
        os_ << indent5 << outvar << "[startidx + 3] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 6] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 4] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 7] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 5] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 8] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 2)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Third Center\n";
        os_ << indent5 << outvar << "[startidx + 6] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 3] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 7] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 4] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 8] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 5] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 3)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Fourth Center\n";
        os_ << indent5 << outvar << "[startidx +  9] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 3] + " << outvar << "[startidx + 6]);\n";
        os_ << indent5 << outvar << "[startidx + 10] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 4] + " << outvar << "[startidx + 7]);\n";
        os_ << indent5 << outvar << "[startidx + 11] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 5] + " << outvar << "[startidx + 8]);\n";
    }

    os_ << "\n\n";
    os_ << indent5 << "startidx += 12;\n";
    os_ << indent4 << "} // close loop for forming derivatives\n\n";

}